

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::numbers_internal::safe_strto128_base
          (numbers_internal *this,string_view text,Nonnull<int128_*> value,int base)

{
  numbers_internal *pnVar1;
  numbers_internal nVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  numbers_internal *in_RAX;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  numbers_internal *pnVar12;
  ulong *puVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  undefined4 in_register_00000084;
  numbers_internal *pnVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  numbers_internal *pnVar23;
  numbers_internal *pnVar24;
  undefined1 auVar25 [16];
  
  pnVar23 = (numbers_internal *)CONCAT44(in_register_00000084,base);
  puVar13 = (ulong *)text._M_str;
  pnVar24 = (numbers_internal *)text._M_len;
  uVar21 = (uint)value;
  *puVar13 = 0;
  puVar13[1] = 0;
  if (pnVar24 == (numbers_internal *)0x0) {
LAB_002ad94d:
    bVar11 = false;
  }
  else {
    pnVar12 = pnVar24;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[(byte)*pnVar12] & 8) == 0) break;
        pnVar12 = pnVar12 + 1;
      } while (pnVar12 < pnVar24 + (long)this);
    }
    pnVar17 = pnVar24 + 1;
    in_RAX = pnVar24;
    do {
      if (in_RAX + (long)this <= pnVar12) goto LAB_002ad94d;
      pnVar1 = in_RAX + -1;
      pnVar17 = pnVar17 + -1;
      in_RAX = in_RAX + -1;
    } while (((&ascii_internal::kPropertyBits)[(byte)pnVar1[(long)this]] & 8) != 0);
    nVar2 = *pnVar12;
    pnVar1 = in_RAX + (long)this;
    in_RAX = (numbers_internal *)(ulong)(nVar2 == (numbers_internal)0x2d);
    if (((nVar2 == (numbers_internal)0x2d) || (nVar2 == (numbers_internal)0x2b)) &&
       (pnVar12 = pnVar12 + 1, pnVar1 + 1 <= pnVar12)) {
LAB_002adb93:
      bVar11 = false;
    }
    else {
      if (uVar21 == 0x10) {
        pnVar23 = pnVar17 + ((long)this - (long)pnVar12);
        uVar16 = 0x10;
        if (((1 < (long)pnVar23) && (*pnVar12 == (numbers_internal)0x30)) &&
           (pnVar23 = (numbers_internal *)(ulong)((byte)pnVar12[1] | 0x20),
           ((byte)pnVar12[1] | 0x20) == 0x78)) {
LAB_002adb7d:
          pnVar12 = pnVar12 + 2;
          uVar16 = 0x10;
          if (pnVar1 + 1 <= pnVar12) goto LAB_002adb93;
        }
      }
      else if (uVar21 == 0) {
        if (((1 < (long)(pnVar17 + ((long)this - (long)pnVar12))) &&
            (*pnVar12 == (numbers_internal)0x30)) &&
           (pnVar23 = (numbers_internal *)(ulong)((byte)pnVar12[1] | 0x20),
           ((byte)pnVar12[1] | 0x20) == 0x78)) goto LAB_002adb7d;
        if ((long)(pnVar17 + ((long)this - (long)pnVar12)) < 1) {
          uVar16 = 10;
        }
        else {
          nVar2 = *pnVar12;
          pnVar12 = pnVar12 + (nVar2 == (numbers_internal)0x30);
          uVar16 = (uint)(nVar2 != (numbers_internal)0x30) * 2 + 8;
        }
      }
      else {
        uVar16 = uVar21;
        if (0x22 < uVar21 - 2) goto LAB_002adb93;
      }
      uVar21 = uVar16;
      this = pnVar17 + ((long)this - (long)pnVar12);
      bVar11 = true;
      pnVar24 = pnVar12;
    }
  }
  if (!bVar11) {
    return false;
  }
  if (((ulong)in_RAX & 1) == 0) {
    if ((int)uVar21 < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x3db,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::int128]"
                   );
    }
    uVar22 = CONCAT44(0,uVar21);
    uVar4 = *(ulong *)*(undefined1 (*) [16])
                       ((anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::
                        kVmaxOverBase + uVar22 * 0x10);
    lVar5 = *(long *)((anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::kVmaxOverBase
                     + uVar22 * 0x10 + 8);
    auVar7 = *(undefined1 (*) [16])
              ((anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::kVmaxOverBase +
              uVar22 * 0x10);
    if ((1 < (int)uVar21) &&
       (auVar25 = __udivti3(0xffffffffffffffff,0x7fffffffffffffff,uVar22,0,pnVar23),
       auVar25 != auVar7)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x3e0,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::int128]"
                   );
    }
    if (0 < (long)this) {
      pnVar23 = this + (long)pnVar24;
      bVar11 = false;
      uVar10 = 0;
      uVar15 = 0;
      do {
        uVar9 = (ulong)(char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar24];
        lVar19 = (long)((char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar24] >> 7);
        if ((long)(ulong)(uVar9 < uVar22) <= lVar19) break;
        uVar20 = (ulong)(uVar4 < uVar10);
        lVar18 = lVar5 - uVar15;
        if ((SBORROW8(lVar5,uVar15) != SBORROW8(lVar18,uVar20)) != (long)(lVar18 - uVar20) < 0) {
LAB_002adb41:
          uVar10 = 0xffffffffffffffff;
          uVar15 = 0x7fffffffffffffff;
          break;
        }
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar10;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar22;
        uVar20 = SUB168(auVar7 * auVar25,0);
        lVar14 = SUB168(auVar7 * auVar25,8) + uVar15 * uVar22;
        lVar18 = (0x7fffffffffffffff - lVar19) - lVar14;
        if ((SBORROW8(0x7fffffffffffffff - lVar19,lVar14) !=
            SBORROW8(lVar18,(ulong)(~uVar9 < uVar20))) !=
            (long)(lVar18 - (ulong)(~uVar9 < uVar20)) < 0) goto LAB_002adb41;
        uVar10 = uVar20 + uVar9;
        uVar15 = lVar19 + lVar14 + (ulong)CARRY8(uVar20,uVar9);
        pnVar24 = pnVar24 + 1;
        bVar11 = pnVar24 >= pnVar23;
      } while (pnVar24 < pnVar23);
      goto LAB_002adbc2;
    }
  }
  else {
    uVar22 = (ulong)(int)uVar21;
    uVar4 = *(ulong *)*(undefined1 (*) [16])
                       ((anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::
                        kVminOverBase + uVar22 * 0x10);
    lVar5 = *(long *)((anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::kVminOverBase
                     + uVar22 * 0x10 + 8);
    auVar7 = *(undefined1 (*) [16])
              ((anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::kVminOverBase +
              uVar22 * 0x10);
    if ((1 < (int)uVar21) && (auVar25 = __divti3(0,0x8000000000000000,uVar21,0), auVar25 != auVar7))
    {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x403,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::int128]"
                   );
    }
    if (0 < (long)this) {
      pnVar23 = this + (long)pnVar24;
      bVar11 = false;
      uVar10 = 0;
      uVar15 = 0;
      do {
        cVar3 = (anonymous_namespace)::kAsciiToInt[(byte)*pnVar24];
        if ((int)uVar21 <= (int)cVar3) break;
        uVar9 = (ulong)(uVar10 < uVar4);
        lVar19 = uVar15 - lVar5;
        if ((SBORROW8(uVar15,lVar5) != SBORROW8(lVar19,uVar9)) != (long)(lVar19 - uVar9) < 0) {
LAB_002adb37:
          uVar10 = 0;
          uVar15 = 0x8000000000000000;
          break;
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar10;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar22;
        uVar9 = SUB168(auVar6 * auVar8,0);
        uVar20 = (ulong)(int)cVar3;
        lVar18 = uVar15 * uVar22 + uVar10 * (long)((int)uVar21 >> 0x1f) + SUB168(auVar6 * auVar8,8);
        uVar15 = (long)(cVar3 >> 7) ^ 0x8000000000000000;
        lVar19 = lVar18 - uVar15;
        if ((SBORROW8(lVar18,uVar15) != SBORROW8(lVar19,(ulong)(uVar9 < uVar20))) !=
            (long)(lVar19 - (ulong)(uVar9 < uVar20)) < 0) goto LAB_002adb37;
        uVar10 = uVar9 - uVar20;
        uVar15 = (lVar18 - (cVar3 >> 7)) - (ulong)(uVar9 < uVar20);
        pnVar24 = pnVar24 + 1;
        bVar11 = pnVar24 >= pnVar23;
      } while (pnVar24 < pnVar23);
      goto LAB_002adbc2;
    }
  }
  bVar11 = (long)this < 1;
  uVar10 = 0;
  uVar15 = 0;
LAB_002adbc2:
  *puVar13 = uVar10;
  puVar13[1] = uVar15;
  return bVar11;
}

Assistant:

bool safe_strto128_base(absl::string_view text, absl::Nonnull<int128*> value,
                        int base) {
  return safe_int_internal<absl::int128>(text, value, base);
}